

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O3

CLDouble * __thiscall CLDouble::operator=(CLDouble *this,string *other)

{
  stringstream sstream;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::operator<<(local_188,(string *)other);
  std::istream::operator>>((istream *)asStack_198,&(this->super_CLParam<double>).value);
  (this->super_CLParam<double>).is_set = true;
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return this;
}

Assistant:

CLDouble& operator=(const std::string& other) {
        std::stringstream sstream ;
        sstream << other ;
        sstream >> value ;
        is_set = true ;
        return *this ;
    }